

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

string * __thiscall
flatbuffers::SimpleFloatConstantGenerator::Inf_abi_cxx11_
          (string *__return_storage_ptr__,SimpleFloatConstantGenerator *this,double v)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)(&this->pos_inf_number_ + (v < 0.0)));
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleFloatConstantGenerator::Inf(double v) const {
  return (v < 0) ? neg_inf_number_ : pos_inf_number_;
}